

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
ft::vector<char,_ft::allocator<char>_>::vector
          (vector<char,_ft::allocator<char>_> *this,vector<char,_ft::allocator<char>_> *other)

{
  size_t in_RDX;
  
  this->m_data = (pointer)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  if ((void *)other->m_capacity != (void *)0x0) {
    realloc(this,(void *)other->m_capacity,in_RDX);
  }
  vector<char,ft::allocator<char>>::assign<char_const*>
            ((vector<char,ft::allocator<char>> *)this,other->m_data,other->m_data + other->m_size,
             (type *)0x0);
  return;
}

Assistant:

vector(vector const & other):
		m_data(NULL),
		m_size(0),
		m_capacity(0),
		m_alloc(other.get_allocator()) {
		this->reserve(other.capacity());
		this->assign(other.begin(), other.end());
	}